

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ord_hash_set.h
# Opt level: O0

void __thiscall re2c::ord_hash_set_t::~ord_hash_set_t(ord_hash_set_t *this)

{
  iterator __first;
  iterator __last;
  ord_hash_set_t *this_local;
  
  __first = std::
            vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
            ::begin(&this->elems);
  __last = std::
           vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>::
           end(&this->elems);
  __std__for_each<__gnu_cxx::__normal_iterator<re2c::ord_hash_set_t::elem_t**,std::vector<re2c::ord_hash_set_t::elem_t*,std::allocator<re2c::ord_hash_set_t::elem_t*>>>,void(*)(void*)noexcept>___gnu_cxx____normal_iterator<re2c::ord_hash_set_t::elem_t**,std::vector<re2c::ord_hash_set_t::elem_t*,std::allocator<re2c::ord_hash_set_t::elem_t*>>>___gnu_cxx____normal_iterator<re2c::ord_hash_set_t::elem_t**,std::vector<re2c::ord_hash_set_t::elem_t*,std::allocator<re2c::ord_hash_set_t::elem_t*>>>_void____void__noexcept__
            ((__normal_iterator<re2c::ord_hash_set_t::elem_t_**,_std::vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>_>
              )__first._M_current,
             (__normal_iterator<re2c::ord_hash_set_t::elem_t_**,_std::vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>_>
              )__last._M_current,free);
  std::
  map<unsigned_long,_re2c::ord_hash_set_t::elem_t_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_re2c::ord_hash_set_t::elem_t_*>_>_>
  ::~map(&this->lookup);
  std::vector<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>::
  ~vector(&this->elems);
  return;
}

Assistant:

ord_hash_set_t::~ord_hash_set_t()
{
	std::for_each(elems.begin(), elems.end(), free);
}